

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenSIMDLoadSetPtr(BinaryenExpressionRef expr,BinaryenExpressionRef ptrExpr)

{
  if (expr->_id != SIMDLoadId) {
    __assert_fail("expression->is<SIMDLoad>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xd37,"void BinaryenSIMDLoadSetPtr(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (ptrExpr != (BinaryenExpressionRef)0x0) {
    expr[2].type.id = (uintptr_t)ptrExpr;
    return;
  }
  __assert_fail("ptrExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xd38,"void BinaryenSIMDLoadSetPtr(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenSIMDLoadSetPtr(BinaryenExpressionRef expr,
                            BinaryenExpressionRef ptrExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<SIMDLoad>());
  assert(ptrExpr);
  static_cast<SIMDLoad*>(expression)->ptr = (Expression*)ptrExpr;
}